

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O1

void __thiscall
wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::
equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::
LocalizerPass::handleCall(wasm::Expression*,wasm::HeapType_
          (void *this,Expression *call,HeapType type)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 uVar4;
  const_iterator cVar5;
  Expression *pEVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  undefined1 local_70 [8];
  ChildLocalizer localizer;
  HeapType type_local;
  
  localizer._40_8_ = type.id;
  cVar5 = std::
          _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(*(_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   **)((long)this + 0x130),(key_type *)&localizer.hasUnreachableChild);
  if (cVar5.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0) {
    ChildLocalizer::ChildLocalizer
              ((ChildLocalizer *)local_70,call,*(Function **)((long)this + 0x120),
               *(Module **)((long)this + 0x128),(PassOptions *)(*(long *)((long)this + 8) + 0x30));
    pEVar6 = ChildLocalizer::getReplacement((ChildLocalizer *)local_70);
    if (pEVar6 != call) {
      lVar1 = *(long *)((long)this + 0x120);
      if ((lVar1 != 0) &&
         (uVar2 = **(ulong **)((long)this + 0x58), type_local.id = (uintptr_t)pEVar6,
         *(long *)(lVar1 + 0xf0) != 0)) {
        sVar7 = std::
                _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)(lVar1 + 0xd8),(key_type *)&type_local);
        if (sVar7 == 0) {
          uVar9 = uVar2 % *(ulong *)(lVar1 + 0xe0);
          plVar10 = *(long **)(*(long *)(lVar1 + 0xd8) + uVar9 * 8);
          plVar11 = (long *)0x0;
          if ((plVar10 != (long *)0x0) &&
             (plVar3 = (long *)*plVar10, plVar11 = plVar10, ((long *)*plVar10)[1] != uVar2)) {
            while (plVar10 = plVar3, plVar3 = (long *)*plVar10, plVar3 != (long *)0x0) {
              plVar11 = (long *)0x0;
              if (((ulong)plVar3[1] % *(ulong *)(lVar1 + 0xe0) != uVar9) ||
                 (plVar11 = plVar10, plVar3[1] == uVar2)) goto LAB_0078718d;
            }
            plVar11 = (long *)0x0;
          }
LAB_0078718d:
          if (plVar11 == (long *)0x0) {
            lVar12 = 0;
          }
          else {
            lVar12 = *plVar11;
          }
          if (lVar12 != 0) {
            pmVar8 = std::__detail::
                     _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)(lVar1 + 0xd8),(key_type *)&type_local);
            *(undefined8 *)
             ((long)&(pmVar8->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                     _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                     _M_payload._M_value.symbolNameIndex.
                     super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) =
                 *(undefined8 *)(lVar12 + 0x20);
            uVar4 = *(undefined8 *)(lVar12 + 0x18);
            *(undefined8 *)
             &(pmVar8->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
              super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
                 *(undefined8 *)(lVar12 + 0x10);
            *(undefined8 *)
             ((long)&(pmVar8->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                     _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                     _M_payload + 8) = uVar4;
          }
        }
      }
      **(undefined8 **)((long)this + 0x58) = pEVar6;
      *(undefined1 *)((long)this + 0x138) = 1;
    }
    if (localizer.wasm != (Module *)0x0) {
      operator_delete(localizer.wasm,
                      (long)localizer.sets.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)localizer.wasm);
    }
  }
  return;
}

Assistant:

void handleCall(Expression* call, HeapType type) {
      if (!callTargets.count(type)) {
        return;
      }

      ChildLocalizer localizer(
        call, getFunction(), *getModule(), getPassOptions());
      auto* replacement = localizer.getReplacement();
      if (replacement != call) {
        replaceCurrent(replacement);
        optimized = true;
      }
    }